

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O3

domain_manager * __thiscall cs::domain_manager::add_record(domain_manager *this,string *name)

{
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pfVar1;
  bool bVar2;
  runtime_error *this_00;
  long *plVar3;
  error *this_01;
  size_type *psVar4;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar2 = exist_record(this,name);
  if (bVar2) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::operator+(&local_38,"Redefinition of variable \"",name);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_38);
    local_58._M_dataplus._M_p = (pointer)*plVar3;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)local_58._M_dataplus._M_p == psVar4) {
      local_58.field_2._M_allocated_capacity = *psVar4;
      local_58.field_2._8_8_ = plVar3[3];
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    }
    else {
      local_58.field_2._M_allocated_capacity = *psVar4;
    }
    local_58._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    runtime_error::runtime_error(this_00,&local_58);
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  pfVar1 = (this->m_set).m_current;
  if (pfVar1 != (this->m_set).m_start) {
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::
    emplace<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
                *)&local_58,
               &pfVar1[-1].
                super_raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ,name);
    return this;
  }
  this_01 = (error *)__cxa_allocate_exception(0x28);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58.field_2._M_allocated_capacity._0_6_ = 0x4830303045;
  local_58._M_string_length = 5;
  cov::error::error(this_01,&local_58);
  __cxa_throw(this_01,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

domain_manager &add_record(const string &name)
		{
			if (exist_record(name))
				throw runtime_error("Redefinition of variable \"" + name + "\".");
			else
				m_set.top().emplace(name);
			return *this;
		}